

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O2

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,string *aValue,Scope aScope)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  allocator_type local_1;
  
  this->mScope = aScope;
  this->mType = aType;
  __first._M_current = (aValue->_M_dataplus)._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->mValue,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + aValue->_M_string_length),&local_1);
  return;
}

Assistant:

Tlv::Tlv(Type aType, const std::string &aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
    , mValue(aValue.begin(), aValue.end())
{
}